

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O3

void mbedtls_ssl_reset_in_out_pointers(mbedtls_ssl_context *ssl)

{
  uchar *puVar1;
  uchar *puVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uchar *puVar6;
  uchar *puVar7;
  
  puVar1 = ssl->out_buf;
  if (ssl->conf->transport == '\x01') {
    ssl->out_hdr = puVar1;
    puVar2 = ssl->in_buf;
    lVar3 = 0xd;
    lVar4 = 3;
    lVar5 = 0xb;
    puVar6 = puVar1;
    puVar7 = puVar1 + 3;
  }
  else {
    puVar6 = puVar1 + 8;
    ssl->out_hdr = puVar6;
    puVar2 = ssl->in_buf + 8;
    lVar3 = 5;
    lVar4 = -8;
    lVar5 = 3;
    puVar7 = puVar1;
  }
  ssl->in_hdr = puVar2;
  ssl->out_ctr = puVar7;
  ssl->out_len = puVar1 + 0xb;
  ssl->out_iv = puVar6 + lVar3;
  ssl->out_msg = puVar6 + lVar3;
  ssl->in_ctr = puVar2 + lVar4;
  ssl->in_len = puVar2 + lVar5;
  ssl->in_iv = puVar2 + lVar3;
  ssl->in_msg = puVar2 + lVar3;
  return;
}

Assistant:

void mbedtls_ssl_reset_in_out_pointers(mbedtls_ssl_context *ssl)
{
    /* Set the incoming and outgoing record pointers. */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM) {
        ssl->out_hdr = ssl->out_buf;
        ssl->in_hdr  = ssl->in_buf;
    } else
#endif /* MBEDTLS_SSL_PROTO_DTLS */
    {
        ssl->out_ctr = ssl->out_buf;
        ssl->out_hdr = ssl->out_buf + 8;
        ssl->in_hdr  = ssl->in_buf  + 8;
    }

    /* Derive other internal pointers. */
    mbedtls_ssl_update_out_pointers(ssl, NULL /* no transform enabled */);
    mbedtls_ssl_update_in_pointers(ssl);
}